

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

void Ivy_ManCutTruthOne(Ivy_Man_t *p,Ivy_Obj_t *pNode,Vec_Int_t *vTruth,int nWords)

{
  int *piVar1;
  Ivy_Obj_t *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  piVar1 = vTruth->pArray;
  iVar3 = pNode->TravId << 3;
  iVar4 = *(int *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 4) << 3;
  pIVar2 = pNode->pFanin1;
  iVar5 = *(int *)(((ulong)pIVar2 & 0xfffffffffffffffe) + 4) << 3;
  if ((*(uint *)&pNode->field_0x8 & 0xf) == 6) {
    if (0 < nWords) {
      uVar6 = 0;
      do {
        piVar1[(long)iVar3 + uVar6] = piVar1[(long)iVar5 + uVar6] ^ piVar1[(long)iVar4 + uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nWords != uVar6);
    }
  }
  else if (((ulong)pNode->pFanin0 & 1) == 0) {
    if (((ulong)pIVar2 & 1) == 0) {
      if (0 < nWords) {
        uVar6 = 0;
        do {
          piVar1[(long)iVar3 + uVar6] = piVar1[(long)iVar5 + uVar6] & piVar1[(long)iVar4 + uVar6];
          uVar6 = uVar6 + 1;
        } while ((uint)nWords != uVar6);
      }
    }
    else if (0 < nWords) {
      uVar6 = 0;
      do {
        piVar1[(long)iVar3 + uVar6] = ~piVar1[(long)iVar5 + uVar6] & piVar1[(long)iVar4 + uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nWords != uVar6);
    }
  }
  else if (((ulong)pIVar2 & 1) == 0) {
    if (0 < nWords) {
      uVar6 = 0;
      do {
        piVar1[(long)iVar3 + uVar6] = ~piVar1[(long)iVar4 + uVar6] & piVar1[(long)iVar5 + uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nWords != uVar6);
    }
  }
  else if (0 < nWords) {
    uVar6 = 0;
    do {
      piVar1[(long)iVar3 + uVar6] = ~(piVar1[(long)iVar5 + uVar6] | piVar1[(long)iVar4 + uVar6]);
      uVar6 = uVar6 + 1;
    } while ((uint)nWords != uVar6);
  }
  return;
}

Assistant:

void Ivy_ManCutTruthOne( Ivy_Man_t * p, Ivy_Obj_t * pNode, Vec_Int_t * vTruth, int nWords )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    int i;
    pTruth  = Ivy_ObjGetTruthStore( pNode->TravId, vTruth );
    pTruth0 = Ivy_ObjGetTruthStore( Ivy_ObjFanin0(pNode)->TravId, vTruth );
    pTruth1 = Ivy_ObjGetTruthStore( Ivy_ObjFanin1(pNode)->TravId, vTruth );
    if ( Ivy_ObjIsExor(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Ivy_ObjFaninC0(pNode) && !Ivy_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Ivy_ObjFaninC0(pNode) && Ivy_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Ivy_ObjFaninC0(pNode) && !Ivy_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Ivy_ObjFaninC0(pNode) && Ivy_ObjFaninC1(pNode) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
}